

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O2

void aom_calc_highbd_psnr
               (YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b,PSNR_STATS *psnr,uint32_t bit_depth,
               uint32_t in_bit_depth)

{
  uint a_stride;
  uint b_stride;
  int width;
  int height;
  uint8_t *a_00;
  uint8_t *b_00;
  uint64_t uVar1;
  int64_t iVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  undefined4 in_register_00000084;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int b_strides [3];
  int a_strides [3];
  int heights [3];
  int widths [3];
  uint local_80 [12];
  undefined8 local_50;
  double local_48;
  YV12_BUFFER_CONFIG *local_40;
  uint64_t local_38;
  
  local_80[9] = (a->field_2).field_0.y_crop_width;
  local_80[10] = (a->field_2).field_0.uv_crop_width;
  local_80[0xb] = local_80[10];
  local_80[6] = (a->field_3).field_0.y_crop_height;
  local_80[7] = (a->field_3).field_0.uv_crop_height;
  local_80[8] = local_80[7];
  local_80[3] = (a->field_4).field_0.y_stride;
  local_80[4] = (a->field_4).field_0.uv_stride;
  local_80[5] = local_80[4];
  local_80[0] = (b->field_4).field_0.y_stride;
  local_80[1] = (b->field_4).field_0.uv_stride;
  local_48 = (double)(0xff << ((char)in_bit_depth - 8U & 0x1f));
  local_80[2] = local_80[1];
  local_50 = CONCAT44(in_register_00000084,in_bit_depth);
  bVar3 = (char)bit_depth - (char)in_bit_depth;
  uVar4 = 0;
  uVar1 = 0;
  local_40 = b;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    uVar14 = local_80[lVar13 + 9];
    uVar7 = local_80[lVar13 + 6];
    a_00 = a->store_buf_adr[lVar13 + -4];
    a_stride = local_80[lVar13 + 3];
    b_00 = local_40->store_buf_adr[lVar13 + -4];
    b_stride = local_80[lVar13];
    local_38 = uVar1;
    if ((a->flags & 8) == 0) {
      uVar1 = get_sse(a_00,a_stride,b_00,b_stride,uVar14,uVar7);
    }
    else if (bit_depth == (uint32_t)local_50) {
      uVar1 = highbd_get_sse(a_00,a_stride,b_00,b_stride,uVar14,uVar7);
    }
    else {
      lVar9 = (long)a_00 * 2;
      lVar6 = (long)b_00 * 2;
      uVar1 = 0;
      uVar8 = 0;
      if (0 < (int)uVar14) {
        uVar8 = (ulong)uVar14;
      }
      uVar10 = 0;
      if (0 < (int)uVar7) {
        uVar10 = uVar7;
      }
      for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
        for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
          lVar5 = (long)(int)((uint)(*(ushort *)(lVar9 + uVar12 * 2) >> (bVar3 & 0x1f)) -
                             (uint)(*(ushort *)(lVar6 + uVar12 * 2) >> (bVar3 & 0x1f)));
          uVar1 = uVar1 + lVar5 * lVar5;
        }
        lVar6 = lVar6 + (long)(int)b_stride * 2;
        lVar9 = lVar9 + (long)(int)a_stride * 2;
      }
    }
    uVar7 = uVar7 * uVar14;
    psnr->sse[lVar13 + 1] = uVar1;
    psnr->samples[lVar13 + 1] = uVar7;
    auVar17._8_4_ = (int)(uVar1 >> 0x20);
    auVar17._0_8_ = uVar1;
    auVar17._12_4_ = 0x45300000;
    dVar15 = aom_sse_to_psnr((double)uVar7,local_48,
                             (auVar17._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    psnr->psnr[lVar13 + 1] = dVar15;
    uVar1 = local_38 + uVar1;
    uVar4 = uVar4 + uVar7;
  }
  psnr->sse[0] = uVar1;
  auVar18._8_4_ = (int)(uVar1 >> 0x20);
  auVar18._0_8_ = uVar1;
  auVar18._12_4_ = 0x45300000;
  psnr->samples[0] = uVar4;
  dVar15 = aom_sse_to_psnr((double)uVar4,local_48,
                           (auVar18._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  psnr->psnr[0] = dVar15;
  if (((uint)local_50 < bit_depth) && ((a->flags & 8U) != 0)) {
    dVar15 = (double)(0xff << ((char)bit_depth - 8U & 0x1f));
    uVar4 = 0;
    uVar1 = 0;
    for (lVar13 = 0; lVar13 != 0xc; lVar13 = lVar13 + 4) {
      width = *(int *)((long)local_80 + lVar13 + 0x24);
      height = *(int *)((long)local_80 + lVar13 + 0x18);
      uVar14 = height * width;
      iVar2 = highbd_get_sse(*(uint8_t **)((long)a->store_buf_adr + lVar13 * 2 + -0x20),
                             *(int *)((long)local_80 + lVar13 + 0xc),
                             *(uint8_t **)((long)local_40->store_buf_adr + lVar13 * 2 + -0x20),
                             *(int *)((long)local_80 + lVar13),width,height);
      *(int64_t *)((long)psnr->sse_hbd + lVar13 * 2 + 8) = iVar2;
      *(uint *)((long)psnr->samples_hbd + lVar13 + 4) = uVar14;
      auVar19._8_4_ = (int)((ulong)iVar2 >> 0x20);
      auVar19._0_8_ = iVar2;
      auVar19._12_4_ = 0x45300000;
      dVar16 = aom_sse_to_psnr((double)uVar14,dVar15,
                               (auVar19._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)iVar2) - 4503599627370496.0));
      *(double *)((long)psnr->psnr_hbd + lVar13 * 2 + 8) = dVar16;
      uVar1 = uVar1 + iVar2;
      uVar4 = uVar14 + uVar4;
    }
    psnr->sse_hbd[0] = uVar1;
    auVar20._8_4_ = (int)(uVar1 >> 0x20);
    auVar20._0_8_ = uVar1;
    auVar20._12_4_ = 0x45300000;
    psnr->samples_hbd[0] = uVar4;
    dVar15 = aom_sse_to_psnr((double)uVar4,dVar15,
                             (auVar20._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    psnr->psnr_hbd[0] = dVar15;
  }
  return;
}

Assistant:

void aom_calc_highbd_psnr(const YV12_BUFFER_CONFIG *a,
                          const YV12_BUFFER_CONFIG *b, PSNR_STATS *psnr,
                          uint32_t bit_depth, uint32_t in_bit_depth) {
  assert(a->y_crop_width == b->y_crop_width);
  assert(a->y_crop_height == b->y_crop_height);
  assert(a->uv_crop_width == b->uv_crop_width);
  assert(a->uv_crop_height == b->uv_crop_height);
  const int widths[3] = { a->y_crop_width, a->uv_crop_width, a->uv_crop_width };
  const int heights[3] = { a->y_crop_height, a->uv_crop_height,
                           a->uv_crop_height };
  const int a_strides[3] = { a->y_stride, a->uv_stride, a->uv_stride };
  const int b_strides[3] = { b->y_stride, b->uv_stride, b->uv_stride };
  int i;
  uint64_t total_sse = 0;
  uint32_t total_samples = 0;
#if CONFIG_LIBVMAF_PSNR_PEAK
  double peak = (double)(255 << (in_bit_depth - 8));
#else
  double peak = (double)((1 << in_bit_depth) - 1);
#endif  // CONFIG_LIBVMAF_PSNR_PEAK
  const unsigned int input_shift = bit_depth - in_bit_depth;

  for (i = 0; i < 3; ++i) {
    const int w = widths[i];
    const int h = heights[i];
    const uint32_t samples = w * h;
    uint64_t sse;
    if (a->flags & YV12_FLAG_HIGHBITDEPTH) {
      if (input_shift) {
        sse = highbd_get_sse_shift(a->buffers[i], a_strides[i], b->buffers[i],
                                   b_strides[i], w, h, input_shift);
      } else {
        sse = highbd_get_sse(a->buffers[i], a_strides[i], b->buffers[i],
                             b_strides[i], w, h);
      }
    } else {
      sse = get_sse(a->buffers[i], a_strides[i], b->buffers[i], b_strides[i], w,
                    h);
    }
    psnr->sse[1 + i] = sse;
    psnr->samples[1 + i] = samples;
    psnr->psnr[1 + i] = aom_sse_to_psnr(samples, peak, (double)sse);

    total_sse += sse;
    total_samples += samples;
  }

  psnr->sse[0] = total_sse;
  psnr->samples[0] = total_samples;
  psnr->psnr[0] =
      aom_sse_to_psnr((double)total_samples, peak, (double)total_sse);

  // Compute PSNR based on stream bit depth
  if ((a->flags & YV12_FLAG_HIGHBITDEPTH) && (in_bit_depth < bit_depth)) {
#if CONFIG_LIBVMAF_PSNR_PEAK
    peak = (double)(255 << (bit_depth - 8));
#else
    peak = (double)((1 << bit_depth) - 1);
#endif  // CONFIG_LIBVMAF_PSNR_PEAK
    total_sse = 0;
    total_samples = 0;
    for (i = 0; i < 3; ++i) {
      const int w = widths[i];
      const int h = heights[i];
      const uint32_t samples = w * h;
      uint64_t sse;
      sse = highbd_get_sse(a->buffers[i], a_strides[i], b->buffers[i],
                           b_strides[i], w, h);
      psnr->sse_hbd[1 + i] = sse;
      psnr->samples_hbd[1 + i] = samples;
      psnr->psnr_hbd[1 + i] = aom_sse_to_psnr(samples, peak, (double)sse);
      total_sse += sse;
      total_samples += samples;
    }

    psnr->sse_hbd[0] = total_sse;
    psnr->samples_hbd[0] = total_samples;
    psnr->psnr_hbd[0] =
        aom_sse_to_psnr((double)total_samples, peak, (double)total_sse);
  }
}